

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O3

reentrant_put_transaction<void> *
density_tests::detail::
PutTestObject<density::lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>,_128UL,_8UL>
::reentrant_put(reentrant_put_transaction<void> *__return_storage_ptr__,
               conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
               *i_queue,EasyRandom *param_2)

{
  reentrant_put_transaction<density_tests::TestObject<128UL,_8UL>_> transaction;
  reentrant_put_transaction<density_tests::TestObject<128UL,_8UL>_> local_108;
  reentrant_put_transaction<density_tests::TestObject<128UL,_8UL>_> local_e8;
  reentrant_put_transaction<density_tests::TestObject<128UL,_8UL>_> local_c8;
  TestObject<128UL,_8UL> local_a0;
  
  TestObject<128UL,_8UL>::TestObject(&local_a0);
  density::
  lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>
  ::
  start_reentrant_emplace<density_tests::TestObject<128ul,8ul>,density_tests::TestObject<128ul,8ul>>
            (&local_e8,
             (lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>
              *)i_queue,&local_a0);
  local_c8.m_put.m_user_storage = local_e8.m_put.m_user_storage;
  local_c8.m_put.m_control_block = local_e8.m_put.m_control_block;
  local_c8.m_put.m_next_ptr = local_e8.m_put.m_next_ptr;
  local_c8.m_queue = local_e8.m_queue;
  local_e8.m_put.m_user_storage = (void *)0x0;
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  ::reentrant_put_transaction<density_tests::TestObject<128UL,_8UL>_>::~reentrant_put_transaction
            (&local_e8);
  local_108.m_put.m_control_block = local_c8.m_put.m_control_block;
  local_108.m_put.m_next_ptr = local_c8.m_put.m_next_ptr;
  local_108.m_put.m_user_storage = local_c8.m_put.m_user_storage;
  local_108.m_queue = local_e8.m_queue;
  local_c8.m_put.m_user_storage = (void *)0x0;
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  ::reentrant_put_transaction<density_tests::TestObject<128UL,_8UL>_>::~reentrant_put_transaction
            (&local_c8);
  TestObject<128UL,_8UL>::~TestObject(&local_a0);
  exception_checkpoint();
  (__return_storage_ptr__->m_put).m_user_storage = local_108.m_put.m_user_storage;
  (__return_storage_ptr__->m_put).m_control_block = local_108.m_put.m_control_block;
  (__return_storage_ptr__->m_put).m_next_ptr = local_108.m_put.m_next_ptr;
  __return_storage_ptr__->m_queue = local_e8.m_queue;
  local_108.m_put.m_user_storage = (void *)0x0;
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  ::reentrant_put_transaction<density_tests::TestObject<128UL,_8UL>_>::~reentrant_put_transaction
            (&local_108);
  return __return_storage_ptr__;
}

Assistant:

static typename QUEUE::template reentrant_put_transaction<void>
              reentrant_put(QUEUE & i_queue, EasyRandom &)
            {
                auto transaction = i_queue.start_reentrant_push(ElementType());
                exception_checkpoint();
                return std::move(transaction);
            }